

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_lines(lua_State *L)

{
  int iVar1;
  char *__filename;
  FILE **ppFVar2;
  FILE *pFVar3;
  int toclose;
  char *filename;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    lua_rawgeti(L,-0x2711,1);
    tofile(L);
    iVar1 = 1;
    toclose = 0;
  }
  else {
    __filename = luaL_checklstring(L,1,(size_t *)0x0);
    ppFVar2 = newfile(L);
    pFVar3 = fopen(__filename,"r");
    *ppFVar2 = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      fileerror(L,(int)__filename,filename);
    }
    iVar1 = lua_gettop(L);
    toclose = 1;
  }
  aux_lines(L,iVar1,toclose);
  return 1;
}

Assistant:

static int io_lines (lua_State *L) {
  if (lua_isnoneornil(L, 1)) {  /* no arguments? */
    /* will iterate over default input */
    lua_rawgeti(L, LUA_ENVIRONINDEX, IO_INPUT);
    return f_lines(L);
  }
  else {
    const char *filename = luaL_checkstring(L, 1);
    FILE **pf = newfile(L);
    *pf = fopen(filename, "r");
    if (*pf == NULL)
      fileerror(L, 1, filename);
    aux_lines(L, lua_gettop(L), 1);
    return 1;
  }
}